

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  Impl *pIVar1;
  bool bVar2;
  uint16_t uVar3;
  Which WVar4;
  uint16_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  bool *pbVar10;
  size_t sVar11;
  unsigned_short *puVar12;
  uint64_t id;
  ArrayPtr<bool> AVar13;
  ArrayPtr<unsigned_short> AVar14;
  Iterator IVar15;
  StringPtr name;
  byte local_4c9;
  byte local_489;
  Fault local_398;
  Fault f_10;
  Fault f_9;
  Fault f_8;
  uint32_t local_34c;
  Fault local_348;
  Fault f_7;
  Reader local_310;
  bool local_2dd;
  uint local_2dc;
  undefined1 local_2d8 [3];
  bool fieldIsPointer;
  uint fieldBits;
  Reader slot;
  Fault f_6;
  Fault f_5;
  Fault f_4;
  Reader ordinal;
  Fault f_3;
  undefined1 local_230 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:338:7)>
  _kjContext338;
  anon_class_8_1_a7e8901a _kjContextFunc338;
  Reader field;
  undefined1 local_198 [8];
  Iterator __end2;
  undefined1 local_178 [8];
  Iterator __begin2;
  Reader *__range2;
  uint nextOrdinal;
  uint index;
  uint nonDiscriminantPos;
  uint discriminantPos;
  Fault local_140;
  Fault f_2;
  Fault f_1;
  Fault local_128;
  Fault f;
  ArrayPtr<bool> sawDiscriminantValue;
  Array<bool> sawDiscriminantValue_heap;
  bool sawDiscriminantValue_stack [32];
  bool sawDiscriminantValue_isOnStack;
  size_t sawDiscriminantValue_size;
  undefined1 local_b0 [8];
  ArrayPtr<bool> sawCodeOrder;
  Array<bool> sawCodeOrder_heap;
  bool sawCodeOrder_stack [32];
  bool sawCodeOrder_isOnStack;
  size_t sawCodeOrder_size;
  Reader fields;
  uint pointerCount;
  uint dataSizeInBits;
  uint64_t scopeId_local;
  Reader *structNode_local;
  Validator *this_local;
  
  uVar3 = capnp::schema::Node::Struct::Reader::getDataWordCount(structNode);
  fields.reader._44_4_ = (uint)uVar3 << 6;
  uVar3 = capnp::schema::Node::Struct::Reader::getPointerCount(structNode);
  fields.reader.nestingLimit = (int)uVar3;
  capnp::schema::Node::Struct::Reader::getFields((Reader *)&sawCodeOrder_size,structNode);
  uVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
  uVar9 = (ulong)uVar6;
  if (uVar9 < 0x21) {
    kj::Array<bool>::Array((Array<bool> *)&sawCodeOrder.size_,(void *)0x0);
    AVar13 = kj::arrayPtr<bool>((bool *)&sawCodeOrder_heap.disposer,uVar9);
  }
  else {
    kj::heapArray<bool>((Array<bool> *)&sawCodeOrder.size_,uVar9);
    AVar13 = kj::Array::operator_cast_to_ArrayPtr((Array *)&sawCodeOrder.size_);
  }
  sawCodeOrder.ptr = (bool *)AVar13.size_;
  local_b0 = (undefined1  [8])AVar13.ptr;
  pbVar10 = kj::ArrayPtr<bool>::begin((ArrayPtr<bool> *)local_b0);
  sVar11 = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)local_b0);
  memset(pbVar10,0,sVar11);
  uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
  uVar9 = (ulong)uVar3;
  if (uVar9 < 0x21) {
    kj::Array<bool>::Array((Array<bool> *)&sawDiscriminantValue.size_,(void *)0x0);
    AVar13 = kj::arrayPtr<bool>((bool *)&sawDiscriminantValue_heap.disposer,uVar9);
  }
  else {
    kj::heapArray<bool>((Array<bool> *)&sawDiscriminantValue.size_,uVar9);
    AVar13 = kj::Array::operator_cast_to_ArrayPtr((Array *)&sawDiscriminantValue.size_);
  }
  sawDiscriminantValue.ptr = (bool *)AVar13.size_;
  f.exception = (Exception *)AVar13.ptr;
  pbVar10 = kj::ArrayPtr<bool>::begin((ArrayPtr<bool> *)&f);
  sVar11 = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)&f);
  memset(pbVar10,0,sVar11);
  uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
  if (uVar3 != 0) {
    uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
    if (uVar3 == 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
                (&local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x143,FAILED,"structNode.getDiscriminantCount() != 1",
                 "\"union must have at least two members\"",
                 (char (*) [37])"union must have at least two members");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&local_128);
      goto LAB_00484ff8;
    }
    uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
    uVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
    if (uVar6 < uVar3) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x145,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                 "\"struct can\'t have more union fields than total fields\"",
                 (char (*) [54])"struct can\'t have more union fields than total fields");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f_2);
      goto LAB_00484ff8;
    }
    uVar7 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset(structNode);
    if ((uint)fields.reader._44_4_ < (uVar7 + 1) * 0x10) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                (&local_140,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x148,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                 "\"union discriminant is out-of-bounds\"",
                 (char (*) [36])"union discriminant is out-of-bounds");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&local_140);
      goto LAB_00484ff8;
    }
  }
  pIVar1 = this->loader;
  uVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
  AVar14 = kj::Arena::allocateArray<unsigned_short>(&pIVar1->arena,(ulong)uVar6);
  this->membersByDiscriminant = AVar14;
  index = 0;
  uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
  nextOrdinal = (uint)uVar3;
  __range2._4_4_ = 0;
  __range2._0_4_ = 0;
  __begin2._8_8_ = &sawCodeOrder_size;
  IVar15 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::begin((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar15.container;
  __begin2.container._0_4_ = IVar15.index;
  local_178 = (undefined1  [8])__end2._8_8_;
  IVar15 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  local_198 = (undefined1  [8])IVar15.container;
  __end2.container._0_4_ = IVar15.index;
  while (bVar2 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                 ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                               *)local_178,
                              (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                               *)local_198), bVar2) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
    ::operator*((Reader *)&_kjContextFunc338,
                (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                 *)local_178);
    _kjContext338.func = &_kjContextFunc338;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:338:7)>
    ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:338:7)>
                   *)local_230,(anon_class_8_1_a7e8901a *)&_kjContext338.func);
    name.content = (ArrayPtr<const_char>)
                   capnp::schema::Field::Reader::getName((Reader *)&_kjContextFunc338);
    validateMemberName(this,name,__range2._4_4_);
    uVar3 = capnp::schema::Field::Reader::getCodeOrder((Reader *)&_kjContextFunc338);
    sVar11 = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)local_b0);
    local_489 = 0;
    if (uVar3 < sVar11) {
      uVar3 = capnp::schema::Field::Reader::getCodeOrder((Reader *)&_kjContextFunc338);
      pbVar10 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_b0,(ulong)uVar3);
      local_489 = *pbVar10 ^ 0xff;
    }
    if ((local_489 & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                ((Fault *)&ordinal._reader.nestingLimit,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x157,FAILED,
                 "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                 ,"\"invalid codeOrder\"",(char (*) [18])"invalid codeOrder");
      this->isValid = false;
      bVar2 = true;
      kj::_::Debug::Fault::~Fault((Fault *)&ordinal._reader.nestingLimit);
    }
    else {
      uVar3 = capnp::schema::Field::Reader::getCodeOrder((Reader *)&_kjContextFunc338);
      pbVar10 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_b0,(ulong)uVar3);
      *pbVar10 = true;
      capnp::schema::Field::Reader::getOrdinal((Reader *)&f_4,(Reader *)&_kjContextFunc338);
      bVar2 = capnp::schema::Field::Ordinal::Reader::isExplicit((Reader *)&f_4);
      if (bVar2) {
        uVar3 = capnp::schema::Field::Ordinal::Reader::getExplicit((Reader *)&f_4);
        if (uVar3 < (uint)__range2) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
                    (&f_5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x15d,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                     "\"fields were not ordered by ordinal\"",
                     (char (*) [35])"fields were not ordered by ordinal");
          this->isValid = false;
          bVar2 = true;
          kj::_::Debug::Fault::~Fault(&f_5);
          goto LAB_00484d6b;
        }
        uVar3 = capnp::schema::Field::Ordinal::Reader::getExplicit((Reader *)&f_4);
        __range2._0_4_ = uVar3 + 1;
      }
      bVar2 = hasDiscriminantValue((Reader *)&_kjContextFunc338);
      if (bVar2) {
        uVar3 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)&_kjContextFunc338);
        sVar11 = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)&f);
        local_4c9 = 0;
        if (uVar3 < sVar11) {
          uVar3 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)&_kjContextFunc338);
          pbVar10 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)&f,(ulong)uVar3);
          local_4c9 = *pbVar10 ^ 0xff;
        }
        if ((local_4c9 & 1) != 0) {
          uVar3 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)&_kjContextFunc338);
          pbVar10 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)&f,(ulong)uVar3);
          *pbVar10 = true;
          uVar9 = (ulong)index;
          index = index + 1;
          puVar12 = kj::ArrayPtr<unsigned_short>::operator[](&this->membersByDiscriminant,uVar9);
          *puVar12 = __range2._4_2_;
          goto LAB_00484b25;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                  (&f_6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x164,FAILED,
                   "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                   ,"\"invalid discriminantValue\"",(char (*) [26])"invalid discriminantValue");
        this->isValid = false;
        bVar2 = true;
        kj::_::Debug::Fault::~Fault(&f_6);
      }
      else {
        uVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size
                          ((Reader *)&sawCodeOrder_size);
        if (uVar6 < nextOrdinal) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    ((Fault *)&slot._reader.nestingLimit,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x16a,FAILED,"nonDiscriminantPos <= fields.size()",
                     "\"discriminantCount did not match fields\"",
                     (char (*) [39])"discriminantCount did not match fields");
          this->isValid = false;
          bVar2 = true;
          kj::_::Debug::Fault::~Fault((Fault *)&slot._reader.nestingLimit);
        }
        else {
          uVar9 = (ulong)nextOrdinal;
          nextOrdinal = nextOrdinal + 1;
          puVar12 = kj::ArrayPtr<unsigned_short>::operator[](&this->membersByDiscriminant,uVar9);
          *puVar12 = __range2._4_2_;
LAB_00484b25:
          WVar4 = capnp::schema::Field::Reader::which((Reader *)&_kjContextFunc338);
          if (WVar4 == SLOT) {
            capnp::schema::Field::Reader::getSlot((Reader *)local_2d8,(Reader *)&_kjContextFunc338);
            local_2dc = 0;
            local_2dd = false;
            capnp::schema::Field::Slot::Reader::getType(&local_310,(Reader *)local_2d8);
            capnp::schema::Field::Slot::Reader::getDefaultValue((Reader *)&f_7,(Reader *)local_2d8);
            validate(this,&local_310,(Reader *)&f_7,&local_2dc,&local_2dd);
            uVar6 = local_2dc;
            uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_2d8);
            bVar2 = false;
            if (uVar6 * (uVar7 + 1) <= (uint)fields.reader._44_4_) {
              uVar8 = (uint)local_2dd;
              uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_2d8);
              bVar2 = (uVar8 & 1) * (uVar7 + 1) <= (uint)fields.reader.nestingLimit;
            }
            if (!bVar2) {
              local_34c = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_2d8);
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                        (&local_348,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                         ,0x178,FAILED,
                         "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                         ,
                         "\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                         ,(char (*) [27])"field offset out-of-bounds",&local_34c,
                         (uint *)&fields.reader.field_0x2c,(uint *)&fields.reader.nestingLimit);
              this->isValid = false;
              bVar2 = true;
              kj::_::Debug::Fault::~Fault(&local_348);
              goto LAB_00484d6b;
            }
          }
          else if (WVar4 == GROUP) {
            capnp::schema::Field::Reader::getGroup((Reader *)&f_8,(Reader *)&_kjContextFunc338);
            id = capnp::schema::Field::Group::Reader::getTypeId((Reader *)&f_8);
            validateTypeId(this,id,STRUCT);
          }
          __range2._4_4_ = __range2._4_4_ + 1;
          bVar2 = false;
        }
      }
    }
LAB_00484d6b:
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:338:7)>
    ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:338:7)>
                    *)local_230);
    if (bVar2) goto LAB_00484ff8;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                  *)local_178);
  }
  uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
  if (index != uVar3) {
    kj::_::Debug::Fault::Fault
              (&f_9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x187,FAILED,"discriminantPos == structNode.getDiscriminantCount()","");
    kj::_::Debug::Fault::fatal(&f_9);
  }
  uVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
  if (nextOrdinal != uVar6) {
    kj::_::Debug::Fault::Fault
              (&f_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x188,FAILED,"nonDiscriminantPos == fields.size()","");
    kj::_::Debug::Fault::fatal(&f_10);
  }
  bVar2 = capnp::schema::Node::Struct::Reader::getIsGroup(structNode);
  if (bVar2) {
    if (scopeId == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
                (&local_398,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x18b,FAILED,"scopeId != 0","\"group node missing scopeId\"",
                 (char (*) [27])"group node missing scopeId");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&local_398);
    }
    else {
      pIVar1 = this->loader;
      uVar3 = capnp::schema::Node::Struct::Reader::getDataWordCount(structNode);
      uVar5 = capnp::schema::Node::Struct::Reader::getPointerCount(structNode);
      SchemaLoader::Impl::requireStructSize(pIVar1,scopeId,(uint)uVar3,(uint)uVar5);
      validateTypeId(this,scopeId,STRUCT);
    }
  }
LAB_00484ff8:
  kj::Array<bool>::~Array((Array<bool> *)&sawDiscriminantValue.size_);
  kj::Array<bool>::~Array((Array<bool> *)&sawCodeOrder.size_);
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }